

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O2

void jpeg_fdct_12x6(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  
  data[0x3c] = 0;
  data[0x3d] = 0;
  data[0x3e] = 0;
  data[0x3f] = 0;
  data[0x38] = 0;
  data[0x39] = 0;
  data[0x3a] = 0;
  data[0x3b] = 0;
  data[0x34] = 0;
  data[0x35] = 0;
  data[0x36] = 0;
  data[0x37] = 0;
  data[0x30] = 0;
  data[0x31] = 0;
  data[0x32] = 0;
  data[0x33] = 0;
  uVar10 = (ulong)start_col;
  for (lVar16 = 0; lVar16 != 0x30; lVar16 = lVar16 + 8) {
    lVar12 = *(long *)((long)sample_data + lVar16);
    bVar1 = *(byte *)(lVar12 + 0xb + uVar10);
    uVar25 = (ulong)((uint)*(byte *)(lVar12 + uVar10) + (uint)bVar1);
    bVar2 = *(byte *)(lVar12 + 1 + uVar10);
    bVar3 = *(byte *)(lVar12 + 2 + uVar10);
    bVar4 = *(byte *)(lVar12 + 9 + uVar10);
    uVar17 = (ulong)((uint)bVar3 + (uint)bVar4);
    bVar5 = *(byte *)(lVar12 + 3 + uVar10);
    bVar6 = *(byte *)(lVar12 + 8 + uVar10);
    uVar22 = (ulong)((uint)bVar5 + (uint)bVar6);
    bVar7 = *(byte *)(lVar12 + 5 + uVar10);
    bVar8 = *(byte *)(lVar12 + 6 + uVar10);
    uVar29 = (ulong)((uint)bVar7 + (uint)bVar8);
    lVar13 = uVar29 + uVar25;
    lVar26 = uVar25 - uVar29;
    lVar15 = uVar22 + uVar17;
    lVar18 = uVar17 - uVar22;
    bVar9 = *(byte *)(lVar12 + 10 + uVar10);
    lVar27 = (ulong)*(byte *)(lVar12 + uVar10) - (ulong)bVar1;
    uVar28 = (uint)bVar2 + (uint)bVar9;
    lVar24 = (ulong)bVar2 - (ulong)bVar9;
    lVar23 = (ulong)bVar3 - (ulong)bVar4;
    bVar1 = *(byte *)(lVar12 + 4 + uVar10);
    bVar2 = *(byte *)(lVar12 + 7 + uVar10);
    lVar14 = (ulong)bVar5 - (ulong)bVar6;
    uVar19 = (uint)bVar1 + (uint)bVar2;
    lVar20 = (ulong)bVar1 - (ulong)bVar2;
    lVar21 = (ulong)bVar7 - (ulong)bVar8;
    lVar12 = (ulong)uVar28 - (ulong)uVar19;
    data[lVar16] = ((int)lVar13 + uVar19 + uVar28 + (int)lVar15) * 4 + -0x1800;
    data[lVar16 + 6] = (((int)lVar26 - (int)lVar12) - (int)lVar18) * 4;
    data[lVar16 + 4] = (DCTELEM)((lVar13 - lVar15) * 0x2731 + 0x400U >> 0xb);
    data[lVar16 + 2] = (DCTELEM)((ulong)(lVar12 + lVar18 * 0x2bb5 + 0x400 + lVar26 * 0x2bb6) >> 0xb)
    ;
    lVar13 = (lVar20 + lVar24) * 0x1151;
    lVar24 = lVar24 * 0x187e + lVar13;
    lVar13 = lVar20 * -0x3b21 + lVar13;
    lVar15 = (lVar23 + lVar27) * 0x23e7;
    lVar12 = (lVar27 + lVar14) * 0x1b8d;
    data[lVar16 + 1] =
         (DCTELEM)((ulong)(lVar21 * 0x5e8 + lVar24 +
                          lVar27 * 0x7ffffffed6a + lVar15 + 0x400 + lVar12) >> 0xb);
    data[lVar16 + 3] =
         (DCTELEM)((lVar21 + lVar23) * 0x7ffffffeeaf + (lVar27 - lVar14) * 0x29cf + lVar13 + 0x400U
                  >> 0xb);
    lVar18 = (lVar14 + lVar23) * -0x5e8;
    data[lVar16 + 5] =
         (DCTELEM)((ulong)(((lVar15 + lVar23 * -0x4add + 0x400 + lVar18) - lVar13) + lVar21 * 0x1b8d
                          ) >> 0xb);
    data[lVar16 + 7] =
         (DCTELEM)((ulong)(lVar21 * 0x7ffffffdc19 + 0x400 +
                          ((lVar14 * 0x173a + lVar12 + lVar18) - lVar24)) >> 0xb);
  }
  for (iVar11 = 7; -1 < iVar11; iVar11 = iVar11 + -1) {
    lVar20 = (long)(data[0x28] + *data);
    lVar18 = (long)(data[0x20] + data[8]);
    lVar12 = (long)(data[0x18] + data[0x10]);
    lVar16 = lVar12 + lVar20;
    lVar14 = (long)(*data - data[0x28]);
    lVar13 = (long)(data[8] - data[0x20]);
    lVar15 = (long)(data[0x10] - data[0x18]);
    *data = (int)((ulong)((lVar16 + lVar18) * 0x38e4 + 0x8000) >> 0x10);
    data[0x10] = (int)((ulong)((lVar20 - lVar12) * 0x45ad + 0x8000) >> 0x10);
    data[0x20] = (int)((ulong)((lVar16 + lVar18 * -2) * 0x283a + 0x8000) >> 0x10);
    lVar16 = (lVar15 + lVar14) * 0x14d3;
    data[8] = (int)((ulong)((lVar13 + lVar14) * 0x38e4 + lVar16 + 0x8000) >> 0x10);
    data[0x18] = (int)((ulong)(((lVar14 - lVar13) - lVar15) * 0x38e4 + 0x8000) >> 0x10);
    data[0x28] = (int)((ulong)((lVar15 - lVar13) * 0x38e4 + lVar16 + 0x8000) >> 0x10);
    data = data + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_12x6 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Zero 2 bottom rows of output coefficient block. */
  MEMZERO(&data[DCTSIZE*6], SIZEOF(DCTELEM) * DCTSIZE * 2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* 12-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/24). */

  dataptr = data;
  for (ctr = 0; ctr < 6; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[11]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[10]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[9]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[8]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[7]);
    tmp5 = GETJSAMPLE(elemptr[5]) + GETJSAMPLE(elemptr[6]);

    tmp10 = tmp0 + tmp5;
    tmp13 = tmp0 - tmp5;
    tmp11 = tmp1 + tmp4;
    tmp14 = tmp1 - tmp4;
    tmp12 = tmp2 + tmp3;
    tmp15 = tmp2 - tmp3;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[11]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[10]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[9]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[8]);
    tmp4 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[7]);
    tmp5 = GETJSAMPLE(elemptr[5]) - GETJSAMPLE(elemptr[6]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp10 + tmp11 + tmp12 - 12 * CENTERJSAMPLE) << PASS1_BITS);
    dataptr[6] = (DCTELEM) ((tmp13 - tmp14 - tmp15) << PASS1_BITS);
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp12, FIX(1.224744871)), /* c4 */
	      CONST_BITS-PASS1_BITS);
    dataptr[2] = (DCTELEM)
      DESCALE(tmp14 - tmp15 + MULTIPLY(tmp13 + tmp15, FIX(1.366025404)), /* c2 */
	      CONST_BITS-PASS1_BITS);

    /* Odd part */

    tmp10 = MULTIPLY(tmp1 + tmp4, FIX_0_541196100);    /* c9 */
    tmp14 = tmp10 + MULTIPLY(tmp1, FIX_0_765366865);   /* c3-c9 */
    tmp15 = tmp10 - MULTIPLY(tmp4, FIX_1_847759065);   /* c3+c9 */
    tmp12 = MULTIPLY(tmp0 + tmp2, FIX(1.121971054));   /* c5 */
    tmp13 = MULTIPLY(tmp0 + tmp3, FIX(0.860918669));   /* c7 */
    tmp10 = tmp12 + tmp13 + tmp14 - MULTIPLY(tmp0, FIX(0.580774953)) /* c5+c7-c1 */
	    + MULTIPLY(tmp5, FIX(0.184591911));        /* c11 */
    tmp11 = MULTIPLY(tmp2 + tmp3, - FIX(0.184591911)); /* -c11 */
    tmp12 += tmp11 - tmp15 - MULTIPLY(tmp2, FIX(2.339493912)) /* c1+c5-c11 */
	    + MULTIPLY(tmp5, FIX(0.860918669));        /* c7 */
    tmp13 += tmp11 - tmp14 + MULTIPLY(tmp3, FIX(0.725788011)) /* c1+c11-c7 */
	    - MULTIPLY(tmp5, FIX(1.121971054));        /* c5 */
    tmp11 = tmp15 + MULTIPLY(tmp0 - tmp3, FIX(1.306562965)) /* c3 */
	    - MULTIPLY(tmp2 + tmp5, FIX_0_541196100);  /* c9 */

    dataptr[1] = (DCTELEM) DESCALE(tmp10, CONST_BITS-PASS1_BITS);
    dataptr[3] = (DCTELEM) DESCALE(tmp11, CONST_BITS-PASS1_BITS);
    dataptr[5] = (DCTELEM) DESCALE(tmp12, CONST_BITS-PASS1_BITS);
    dataptr[7] = (DCTELEM) DESCALE(tmp13, CONST_BITS-PASS1_BITS);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by (8/12)*(8/6) = 8/9, which we
   * partially fold into the constant multipliers and final shifting:
   * 6-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/12) * 16/9.
   */

  dataptr = data;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*5];
    tmp11 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*3];

    tmp10 = tmp0 + tmp2;
    tmp12 = tmp0 - tmp2;

    tmp0 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*5];
    tmp1 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*3];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp11, FIX(1.777777778)),         /* 16/9 */
	      CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp12, FIX(2.177324216)),                 /* c2 */
	      CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp11 - tmp11, FIX(1.257078722)), /* c4 */
	      CONST_BITS+PASS1_BITS+1);

    /* Odd part */

    tmp10 = MULTIPLY(tmp0 + tmp2, FIX(0.650711829));             /* c5 */

    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp0 + tmp1, FIX(1.777777778)),   /* 16/9 */
	      CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*3] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 - tmp1 - tmp2, FIX(1.777777778)),    /* 16/9 */
	      CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*5] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp2 - tmp1, FIX(1.777777778)),   /* 16/9 */
	      CONST_BITS+PASS1_BITS+1);

    dataptr++;			/* advance pointer to next column */
  }
}